

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.cpp
# Opt level: O2

unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> __thiscall
Diligent::CopyPSOCreateInternalInfo(Diligent *this,void *pData)

{
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_20;
  
  *(undefined8 *)this = 0;
  if (pData != (void *)0x0) {
    __p_00 = (pointer)operator_new__(4);
    __p_00[0] = '\0';
    __p_00[1] = '\0';
    __p_00[2] = '\0';
    __p_00[3] = '\0';
    local_20._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p_00)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_20);
    **(undefined4 **)this = *pData;
  }
  return (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Uint8[]> CopyPSOCreateInternalInfo(void* pData)
{
    std::unique_ptr<Uint8[]> pCopy;
    if (pData != nullptr)
    {
        static_assert(std::is_trivially_destructible<PSOCreateInternalInfo>::value, "PSOCreateInternalInfo must be trivially destructible");
        pCopy = std::make_unique<Uint8[]>(sizeof(PSOCreateInternalInfo));
        memcpy(pCopy.get(), pData, sizeof(PSOCreateInternalInfo));
    }

    return pCopy;
}